

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

void on_frame_received(void *context,AMQP_VALUE performative,uint32_t payload_size,
                      uchar *payload_bytes)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  END_HANDLE local_f0;
  END_HANDLE end_handle;
  LINK_ENDPOINT_INSTANCE *link_endpoint_3;
  LINK_ENDPOINT_INSTANCE *pLStack_d8;
  uint32_t i_1;
  LINK_ENDPOINT_INSTANCE *link_endpoint_2;
  delivery_number delivery_id;
  uint32_t remote_handle_2;
  TRANSFER_HANDLE transfer_handle;
  size_t i;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  AMQP_TYPE local_a8;
  uint32_t flow_incoming_window;
  transfer_number flow_next_incoming_id;
  uint32_t remote_handle_1;
  FLOW_HANDLE flow_handle;
  LINK_ENDPOINT_INSTANCE *link_endpoint_1;
  DETACH_HANDLE pDStack_88;
  uint32_t remote_handle;
  DETACH_HANDLE detach_handle;
  LINK_ENDPOINT_HANDLE new_link_endpoint;
  LINK_ENDPOINT_INSTANCE *link_endpoint;
  fields properties;
  AMQP_VALUE target;
  AMQP_VALUE source;
  ATTACH_HANDLE pAStack_50;
  role role;
  ATTACH_HANDLE attach_handle;
  char *name;
  BEGIN_HANDLE begin_handle;
  AMQP_VALUE descriptor;
  SESSION_INSTANCE *session_instance;
  uchar *payload_bytes_local;
  AMQP_VALUE pAStack_18;
  uint32_t payload_size_local;
  AMQP_VALUE performative_local;
  void *context_local;
  
  descriptor = (AMQP_VALUE)context;
  session_instance = (SESSION_INSTANCE *)payload_bytes;
  payload_bytes_local._4_4_ = payload_size;
  pAStack_18 = performative;
  performative_local = (AMQP_VALUE)context;
  begin_handle = (BEGIN_HANDLE)amqpvalue_get_inplace_descriptor(performative);
  _Var1 = is_begin_type_by_descriptor((AMQP_VALUE)begin_handle);
  if (_Var1) {
    iVar2 = amqpvalue_get_begin(pAStack_18,(BEGIN_HANDLE *)&name);
    if (iVar2 == 0) {
      iVar2 = begin_get_incoming_window((BEGIN_HANDLE)name,&descriptor[4].type);
      if ((iVar2 == 0) &&
         (iVar2 = begin_get_next_outgoing_id
                            ((BEGIN_HANDLE)name,(transfer_number *)&descriptor[3].field_0x4),
         iVar2 == 0)) {
        begin_destroy((BEGIN_HANDLE)name);
        if ((descriptor->value).binary_value.length == 2) {
          session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_MAPPED);
        }
        else if ((descriptor->value).binary_value.length == 1) {
          session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_BEGIN_RCVD);
          iVar2 = send_begin((SESSION_INSTANCE *)descriptor);
          if (iVar2 == 0) {
            session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_MAPPED);
          }
          else {
            connection_close(*(CONNECTION_HANDLE *)(descriptor + 1),"amqp:internal-error",
                             "Failed sending BEGIN frame",(AMQP_VALUE)0x0);
            session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_DISCARDING);
          }
        }
      }
      else {
        begin_destroy((BEGIN_HANDLE)name);
        session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_DISCARDING);
        connection_close(*(CONNECTION_HANDLE *)(descriptor + 1),"amqp:decode-error",
                         "Cannot get incoming windows and next outgoing id",(AMQP_VALUE)0x0);
      }
    }
    else {
      connection_close(*(CONNECTION_HANDLE *)(descriptor + 1),"amqp:decode-error",
                       "Cannot decode BEGIN frame",(AMQP_VALUE)0x0);
    }
  }
  else {
    _Var1 = is_attach_type_by_descriptor((AMQP_VALUE)begin_handle);
    if (_Var1) {
      attach_handle = (ATTACH_HANDLE)0x0;
      iVar2 = amqpvalue_get_attach(pAStack_18,&stack0xffffffffffffffb0);
      if (iVar2 == 0) {
        iVar2 = attach_get_name(pAStack_50,(char **)&attach_handle);
        if (iVar2 == 0) {
          iVar2 = attach_get_role(pAStack_50,(role *)((long)&source + 7));
          if (iVar2 == 0) {
            iVar2 = attach_get_source(pAStack_50,&target);
            if (iVar2 != 0) {
              target = (AMQP_VALUE)0x0;
            }
            iVar2 = attach_get_target(pAStack_50,&properties);
            if (iVar2 != 0) {
              properties = (fields)0x0;
            }
            iVar2 = attach_get_properties(pAStack_50,(fields *)&link_endpoint);
            if (iVar2 != 0) {
              link_endpoint = (LINK_ENDPOINT_INSTANCE *)0x0;
            }
            new_link_endpoint =
                 find_link_endpoint_by_name((SESSION_INSTANCE *)descriptor,(char *)attach_handle);
            if (new_link_endpoint == (LINK_ENDPOINT_INSTANCE *)0x0) {
              if (descriptor[2].value.described_value.descriptor != (AMQP_VALUE)0x0) {
                detach_handle =
                     (DETACH_HANDLE)
                     session_create_link_endpoint((SESSION_HANDLE)descriptor,(char *)attach_handle);
                if ((LINK_ENDPOINT_HANDLE)detach_handle == (LINK_ENDPOINT_HANDLE)0x0) {
                  end_session_with_error
                            ((SESSION_INSTANCE *)descriptor,"amqp:internal-error",
                             "Cannot create link endpoint");
                }
                else {
                  iVar2 = attach_get_handle(pAStack_50,
                                            &((LINK_ENDPOINT_HANDLE)detach_handle)->input_handle);
                  if (iVar2 == 0) {
                    *(undefined4 *)&detach_handle[7].composite_value = 1;
                    uVar3 = (*(code *)descriptor[2].value.ulong_value)
                                      (descriptor[2].value.described_value.value,detach_handle,
                                       attach_handle,source._7_1_ & 1,target,properties,
                                       link_endpoint);
                    if ((uVar3 & 1) == 0) {
                      remove_link_endpoint((LINK_ENDPOINT_HANDLE)detach_handle);
                      free_link_endpoint((LINK_ENDPOINT_HANDLE)detach_handle);
                      detach_handle = (DETACH_HANDLE)0x0;
                    }
                    else if (detach_handle[2].composite_value != (AMQP_VALUE)0x0) {
                      (*(code *)detach_handle[2].composite_value)
                                (detach_handle[5].composite_value,pAStack_18,
                                 payload_bytes_local._4_4_,session_instance);
                    }
                  }
                  else {
                    end_session_with_error
                              ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                               "Cannot get input handle from ATTACH frame");
                  }
                }
              }
            }
            else if (new_link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING) {
              iVar2 = attach_get_handle(pAStack_50,&new_link_endpoint->input_handle);
              if (iVar2 == 0) {
                new_link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;
                if ((descriptor[2].value.described_value.descriptor != (AMQP_VALUE)0x0) &&
                   (uVar3 = (*(code *)descriptor[2].value.ulong_value)
                                      (descriptor[2].value.described_value.value,new_link_endpoint,
                                       attach_handle,source._7_1_ & 1,target,properties,
                                       link_endpoint), (uVar3 & 1) == 0)) {
                  new_link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                }
                (*new_link_endpoint->frame_received_callback)
                          (new_link_endpoint->callback_context,pAStack_18,payload_bytes_local._4_4_,
                           (uchar *)session_instance);
              }
              else {
                end_session_with_error
                          ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                           "Cannot get input handle from ATTACH frame");
              }
            }
          }
          else {
            end_session_with_error
                      ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                       "Cannot get link role from ATTACH frame");
          }
        }
        else {
          end_session_with_error
                    ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                     "Cannot get link name from ATTACH frame");
        }
        attach_destroy(pAStack_50);
      }
      else {
        end_session_with_error
                  ((SESSION_INSTANCE *)descriptor,"amqp:decode-error","Cannot decode ATTACH frame");
      }
    }
    else {
      _Var1 = is_detach_type_by_descriptor((AMQP_VALUE)begin_handle);
      if (_Var1) {
        iVar2 = amqpvalue_get_detach(pAStack_18,&stack0xffffffffffffff78);
        if (iVar2 == 0) {
          iVar2 = detach_get_handle(pDStack_88,(handle *)((long)&link_endpoint_1 + 4));
          if (iVar2 == 0) {
            detach_destroy(pDStack_88);
            flow_handle = (FLOW_HANDLE)
                          find_link_endpoint_by_input_handle
                                    ((SESSION_INSTANCE *)descriptor,link_endpoint_1._4_4_);
            if ((LINK_ENDPOINT_INSTANCE *)flow_handle == (LINK_ENDPOINT_INSTANCE *)0x0) {
              end_session_with_error
                        ((SESSION_INSTANCE *)descriptor,"amqp:session:unattached-handle","");
            }
            else if (((LINK_ENDPOINT_INSTANCE *)flow_handle)->link_endpoint_state ==
                     LINK_ENDPOINT_STATE_DETACHING) {
              remove_link_endpoint((LINK_ENDPOINT_HANDLE)flow_handle);
              free_link_endpoint((LINK_ENDPOINT_HANDLE)flow_handle);
            }
            else {
              ((LINK_ENDPOINT_INSTANCE *)flow_handle)->link_endpoint_state =
                   LINK_ENDPOINT_STATE_DETACHING;
              (*((LINK_ENDPOINT_INSTANCE *)flow_handle)->frame_received_callback)
                        (((LINK_ENDPOINT_INSTANCE *)flow_handle)->callback_context,pAStack_18,
                         payload_bytes_local._4_4_,(uchar *)session_instance);
            }
          }
          else {
            end_session_with_error
                      ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                       "Cannot get handle from DETACH frame");
            detach_destroy(pDStack_88);
          }
        }
        else {
          end_session_with_error
                    ((SESSION_INSTANCE *)descriptor,"amqp:decode-error","Cannot decode DETACH frame"
                    );
        }
      }
      else {
        _Var1 = is_flow_type_by_descriptor((AMQP_VALUE)begin_handle);
        if (_Var1) {
          iVar2 = amqpvalue_get_flow(pAStack_18,(FLOW_HANDLE *)&flow_next_incoming_id);
          if (iVar2 == 0) {
            iVar2 = flow_get_next_incoming_id(_flow_next_incoming_id,&local_a8);
            if (iVar2 != 0) {
              local_a8 = descriptor[3].type;
            }
            iVar2 = flow_get_next_outgoing_id
                              (_flow_next_incoming_id,(transfer_number *)&descriptor[3].field_0x4);
            if ((iVar2 == 0) &&
               (iVar2 = flow_get_incoming_window
                                  (_flow_next_incoming_id,
                                   (uint32_t *)((long)&link_endpoint_instance + 4)), iVar2 == 0)) {
              i = 0;
              descriptor[4].type = (local_a8 + link_endpoint_instance._4_4_) - descriptor[3].type;
              iVar2 = flow_get_handle(_flow_next_incoming_id,&flow_incoming_window);
              if (iVar2 == 0) {
                i = (size_t)find_link_endpoint_by_input_handle
                                      ((SESSION_INSTANCE *)descriptor,flow_incoming_window);
              }
              flow_destroy(_flow_next_incoming_id);
              if ((i != 0) && (*(int *)(i + 0x38) != 2)) {
                (**(code **)(i + 0x10))
                          (*(undefined8 *)(i + 0x28),pAStack_18,payload_bytes_local._4_4_,
                           session_instance);
              }
              transfer_handle = (TRANSFER_HANDLE)0x0;
              while( true ) {
                bVar4 = false;
                if (descriptor[4].type != AMQP_TYPE_INVALID) {
                  bVar4 = transfer_handle < (TRANSFER_HANDLE)(ulong)descriptor[2].type;
                }
                if (!bVar4) break;
                if ((*(int *)(*(long *)(&(descriptor[1].value.described_value.value)->type +
                                       (long)transfer_handle * 2) + 0x38) != 2) &&
                   (*(long *)(*(long *)(&(descriptor[1].value.described_value.value)->type +
                                       (long)transfer_handle * 2) + 0x20) != 0)) {
                  (**(code **)(*(long *)(&(descriptor[1].value.described_value.value)->type +
                                        (long)transfer_handle * 2) + 0x20))
                            (*(undefined8 *)
                              (*(long *)(&(descriptor[1].value.described_value.value)->type +
                                        (long)transfer_handle * 2) + 0x28));
                }
                transfer_handle = (TRANSFER_HANDLE)((long)&transfer_handle->composite_value + 1);
              }
            }
            else {
              flow_destroy(_flow_next_incoming_id);
              end_session_with_error
                        ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                         "Cannot decode FLOW frame");
            }
          }
          else {
            end_session_with_error
                      ((SESSION_INSTANCE *)descriptor,"amqp:decode-error","Cannot decode FLOW frame"
                      );
          }
        }
        else {
          _Var1 = is_transfer_type_by_descriptor((AMQP_VALUE)begin_handle);
          if (_Var1) {
            iVar2 = amqpvalue_get_transfer(pAStack_18,(TRANSFER_HANDLE *)&delivery_id);
            if (iVar2 == 0) {
              transfer_get_delivery_id(_delivery_id,(delivery_number *)&link_endpoint_2);
              iVar2 = transfer_get_handle(_delivery_id,(handle *)((long)&link_endpoint_2 + 4));
              if (iVar2 == 0) {
                transfer_destroy(_delivery_id);
                *(int *)&descriptor[3].field_0x4 = *(int *)&descriptor[3].field_0x4 + 1;
                *(int *)&descriptor[4].field_0x4 = *(int *)&descriptor[4].field_0x4 + -1;
                *(int *)((long)&descriptor[3].value + 4) =
                     *(int *)((long)&descriptor[3].value + 4) + -1;
                pLStack_d8 = find_link_endpoint_by_input_handle
                                       ((SESSION_INSTANCE *)descriptor,link_endpoint_2._4_4_);
                if (pLStack_d8 == (LINK_ENDPOINT_INSTANCE *)0x0) {
                  end_session_with_error
                            ((SESSION_INSTANCE *)descriptor,"amqp:session:unattached-handle","");
                }
                else if (pLStack_d8->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING) {
                  (*pLStack_d8->frame_received_callback)
                            (pLStack_d8->callback_context,pAStack_18,payload_bytes_local._4_4_,
                             (uchar *)session_instance);
                }
                if (*(int *)((long)&descriptor[3].value + 4) == 0) {
                  *(uint32_t *)((long)&descriptor[3].value + 4) = descriptor[3].value.uint_value;
                  send_flow((SESSION_INSTANCE *)descriptor);
                }
              }
              else {
                transfer_destroy(_delivery_id);
                end_session_with_error
                          ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                           "Cannot get handle from TRANSFER frame");
              }
            }
            else {
              end_session_with_error
                        ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                         "Cannot decode TRANSFER frame");
            }
          }
          else {
            _Var1 = is_disposition_type_by_descriptor((AMQP_VALUE)begin_handle);
            if (_Var1) {
              for (link_endpoint_3._4_4_ = AMQP_TYPE_INVALID;
                  link_endpoint_3._4_4_ < descriptor[2].type;
                  link_endpoint_3._4_4_ = link_endpoint_3._4_4_ + AMQP_TYPE_NULL) {
                end_handle = *(END_HANDLE *)
                              (&(descriptor[1].value.described_value.value)->type +
                              (ulong)link_endpoint_3._4_4_ * 2);
                if (*(int *)&end_handle[7].composite_value != 2) {
                  (*(code *)end_handle[2].composite_value)
                            (end_handle[5].composite_value,pAStack_18,payload_bytes_local._4_4_,
                             session_instance);
                }
              }
            }
            else {
              _Var1 = is_end_type_by_descriptor((AMQP_VALUE)begin_handle);
              if (_Var1) {
                iVar2 = amqpvalue_get_end(pAStack_18,&local_f0);
                if (iVar2 == 0) {
                  end_destroy(local_f0);
                  if (((descriptor->value).binary_value.length != 6) &&
                     ((descriptor->value).binary_value.length != 7)) {
                    session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_END_RCVD);
                    iVar2 = send_end_frame((SESSION_INSTANCE *)descriptor,(ERROR_HANDLE)0x0);
                    if (iVar2 != 0) {
                      connection_close(*(CONNECTION_HANDLE *)(descriptor + 1),"amqp:internal-error",
                                       "Cannot send END frame.",(AMQP_VALUE)0x0);
                    }
                    session_set_state((SESSION_INSTANCE *)descriptor,SESSION_STATE_DISCARDING);
                  }
                }
                else {
                  end_session_with_error
                            ((SESSION_INSTANCE *)descriptor,"amqp:decode-error",
                             "Cannot decode END frame");
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void on_frame_received(void* context, AMQP_VALUE performative, uint32_t payload_size, const unsigned char* payload_bytes)
{
    SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

    if (is_begin_type_by_descriptor(descriptor))
    {
        BEGIN_HANDLE begin_handle;

        if (amqpvalue_get_begin(performative, &begin_handle) != 0)
        {
            connection_close(session_instance->connection, "amqp:decode-error", "Cannot decode BEGIN frame", NULL);
        }
        else
        {
            if ((begin_get_incoming_window(begin_handle, &session_instance->remote_incoming_window) != 0) ||
                (begin_get_next_outgoing_id(begin_handle, &session_instance->next_incoming_id) != 0))
            {
                /* error */
                begin_destroy(begin_handle);
                session_set_state(session_instance, SESSION_STATE_DISCARDING);
                connection_close(session_instance->connection, "amqp:decode-error", "Cannot get incoming windows and next outgoing id", NULL);
            }
            else
            {
                begin_destroy(begin_handle);

                if (session_instance->session_state == SESSION_STATE_BEGIN_SENT)
                {
                    session_set_state(session_instance, SESSION_STATE_MAPPED);
                }
                else if(session_instance->session_state == SESSION_STATE_UNMAPPED)
                {
                    session_set_state(session_instance, SESSION_STATE_BEGIN_RCVD);
                    if (send_begin(session_instance) != 0)
                    {
                        connection_close(session_instance->connection, "amqp:internal-error", "Failed sending BEGIN frame", NULL);
                        session_set_state(session_instance, SESSION_STATE_DISCARDING);
                    }
                    else
                    {
                        session_set_state(session_instance, SESSION_STATE_MAPPED);
                    }
                }
            }
        }
    }
    else if (is_attach_type_by_descriptor(descriptor))
    {
        const char* name = NULL;
        ATTACH_HANDLE attach_handle;

        if (amqpvalue_get_attach(performative, &attach_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode ATTACH frame");
        }
        else
        {
            role role;
            AMQP_VALUE source;
            AMQP_VALUE target;
            fields properties;

            if (attach_get_name(attach_handle, &name) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get link name from ATTACH frame");
            }
            else if (attach_get_role(attach_handle, &role) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get link role from ATTACH frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;

                if (attach_get_source(attach_handle, &source) != 0)
                {
                    source = NULL;
                }
                if (attach_get_target(attach_handle, &target) != 0)
                {
                    target = NULL;
                }
                if (attach_get_properties(attach_handle, &properties) != 0)
                {
                    properties = NULL;
                }

                link_endpoint = find_link_endpoint_by_name(session_instance, name);
                if (link_endpoint == NULL)
                {
                    /* new link attach */
                    if (session_instance->on_link_attached != NULL)
                    {
                        LINK_ENDPOINT_HANDLE new_link_endpoint = session_create_link_endpoint(session_instance, name);
                        if (new_link_endpoint == NULL)
                        {
                            end_session_with_error(session_instance, "amqp:internal-error", "Cannot create link endpoint");
                        }
                        else if (attach_get_handle(attach_handle, &new_link_endpoint->input_handle) != 0)
                        {
                            end_session_with_error(session_instance, "amqp:decode-error", "Cannot get input handle from ATTACH frame");
                        }
                        else
                        {
                            new_link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;

                            if (!session_instance->on_link_attached(session_instance->on_link_attached_callback_context, new_link_endpoint, name, role, source, target, properties))
                            {
                                remove_link_endpoint(new_link_endpoint);
                                free_link_endpoint(new_link_endpoint);
                                new_link_endpoint = NULL;
                            }
                            else
                            {
                                if (new_link_endpoint->frame_received_callback != NULL)
                                {
                                    new_link_endpoint->frame_received_callback(new_link_endpoint->callback_context, performative, payload_size, payload_bytes);
                                }
                            }
                        }
                    }
                }
                else if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                {
                    if (attach_get_handle(attach_handle, &link_endpoint->input_handle) != 0)
                    {
                        end_session_with_error(session_instance, "amqp:decode-error", "Cannot get input handle from ATTACH frame");
                    }
                    else
                    {
                        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_ATTACHED;

                        if (session_instance->on_link_attached != NULL)
                        {
                            if (!session_instance->on_link_attached(session_instance->on_link_attached_callback_context, link_endpoint, name, role, source, target, properties))
                            {
                                link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                            }
                        }

                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                }
            }

            attach_destroy(attach_handle);
        }
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        DETACH_HANDLE detach_handle;

        if (amqpvalue_get_detach(performative, &detach_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode DETACH frame");
        }
        else
        {
            uint32_t remote_handle;
            if (detach_get_handle(detach_handle, &remote_handle) != 0)
            {
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get handle from DETACH frame");

                detach_destroy(detach_handle);
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;
                detach_destroy(detach_handle);

                link_endpoint = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                if (link_endpoint == NULL)
                {
                    end_session_with_error(session_instance, "amqp:session:unattached-handle", "");
                }
                else
                {
                    if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                    else
                    {
                        /* remove the link endpoint */
                        remove_link_endpoint(link_endpoint);
                        free_link_endpoint(link_endpoint);
                    }
                }
            }
        }
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        FLOW_HANDLE flow_handle;

        if (amqpvalue_get_flow(performative, &flow_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode FLOW frame");
        }
        else
        {
            uint32_t remote_handle;
            transfer_number flow_next_incoming_id;
            uint32_t flow_incoming_window;

            if (flow_get_next_incoming_id(flow_handle, &flow_next_incoming_id) != 0)
            {
                /*
                If the next-incoming-id field of the flow frame is not set,
                then remote-incomingwindow is computed as follows:
                initial-outgoing-id(endpoint) + incoming-window(flow) - next-outgoing-id(endpoint)
                */
                flow_next_incoming_id = session_instance->next_outgoing_id;
            }

            if ((flow_get_next_outgoing_id(flow_handle, &session_instance->next_incoming_id) != 0) ||
                (flow_get_incoming_window(flow_handle, &flow_incoming_window) != 0))
            {
                flow_destroy(flow_handle);

                end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode FLOW frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint_instance = NULL;
                size_t i;

                session_instance->remote_incoming_window = flow_next_incoming_id + flow_incoming_window - session_instance->next_outgoing_id;

                if (flow_get_handle(flow_handle, &remote_handle) == 0)
                {
                    link_endpoint_instance = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                }

                flow_destroy(flow_handle);

                if (link_endpoint_instance != NULL)
                {
                    if (link_endpoint_instance->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint_instance->frame_received_callback(link_endpoint_instance->callback_context, performative, payload_size, payload_bytes);
                    }
                }

                i = 0;
                while ((session_instance->remote_incoming_window > 0) && (i < session_instance->link_endpoint_count))
                {
                    /* notify the caller that it can send here */
                    if (session_instance->link_endpoints[i]->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING &&
                        session_instance->link_endpoints[i]->on_session_flow_on != NULL)
                    {
                        session_instance->link_endpoints[i]->on_session_flow_on(session_instance->link_endpoints[i]->callback_context);
                    }

                    i++;
                }
            }
        }
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        TRANSFER_HANDLE transfer_handle;

        if (amqpvalue_get_transfer(performative, &transfer_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode TRANSFER frame");
        }
        else
        {
            uint32_t remote_handle;
            delivery_number delivery_id;

            transfer_get_delivery_id(transfer_handle, &delivery_id);
            if (transfer_get_handle(transfer_handle, &remote_handle) != 0)
            {
                transfer_destroy(transfer_handle);
                end_session_with_error(session_instance, "amqp:decode-error", "Cannot get handle from TRANSFER frame");
            }
            else
            {
                LINK_ENDPOINT_INSTANCE* link_endpoint;
                transfer_destroy(transfer_handle);

                session_instance->next_incoming_id++;
                session_instance->remote_outgoing_window--;
                session_instance->incoming_window--;

                link_endpoint = find_link_endpoint_by_input_handle(session_instance, remote_handle);
                if (link_endpoint == NULL)
                {
                    end_session_with_error(session_instance, "amqp:session:unattached-handle", "");
                }
                else
                {
                    if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
                    {
                        link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
                    }
                }

                if (session_instance->incoming_window == 0)
                {
                    session_instance->incoming_window = session_instance->desired_incoming_window;
                    send_flow(session_instance);
                }
            }
        }
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        uint32_t i;

        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            LINK_ENDPOINT_INSTANCE* link_endpoint = session_instance->link_endpoints[i];
            if (link_endpoint->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
            {
                link_endpoint->frame_received_callback(link_endpoint->callback_context, performative, payload_size, payload_bytes);
            }
        }
    }
    else if (is_end_type_by_descriptor(descriptor))
    {
        END_HANDLE end_handle;

        if (amqpvalue_get_end(performative, &end_handle) != 0)
        {
            end_session_with_error(session_instance, "amqp:decode-error", "Cannot decode END frame");
        }
        else
        {
            end_destroy(end_handle);
            if ((session_instance->session_state != SESSION_STATE_END_RCVD) &&
                (session_instance->session_state != SESSION_STATE_DISCARDING))
            {
                session_set_state(session_instance, SESSION_STATE_END_RCVD);
                if (send_end_frame(session_instance, NULL) != 0)
                {
                    /* fatal error */
                    (void)connection_close(session_instance->connection, "amqp:internal-error", "Cannot send END frame.", NULL);
                }

                session_set_state(session_instance, SESSION_STATE_DISCARDING);
            }
        }
    }
}